

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defuse.h
# Opt level: O3

int __thiscall mocker::DefUseChain::init(DefUseChain *this,EVP_PKEY_CTX *ctx)

{
  pointer psVar1;
  int iVar2;
  element_type *in_RAX;
  vector<mocker::DefUseChain::Use,std::allocator<mocker::DefUseChain::Use>> *pvVar3;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  EVP_PKEY_CTX *extraout_RAX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *addr;
  EVP_PKEY_CTX *pEVar4;
  EVP_PKEY_CTX *pEVar5;
  EVP_PKEY_CTX *pEVar6;
  shared_ptr<mocker::ir::Reg> sVar7;
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::Reg> reg;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_70;
  EVP_PKEY_CTX *local_58;
  EVP_PKEY_CTX *local_50;
  unsigned_long local_48;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  iVar2 = (int)in_RAX;
  pEVar6 = *(EVP_PKEY_CTX **)(ctx + 0x38);
  pEVar5 = ctx + 0x38;
  if (pEVar6 != pEVar5) {
    do {
      for (pEVar4 = *(EVP_PKEY_CTX **)(pEVar6 + 0x18); iVar2 = (int)in_RAX, pEVar4 != pEVar6 + 0x18;
          pEVar4 = *(EVP_PKEY_CTX **)pEVar4) {
        sVar7 = ir::getDest((ir *)&local_70,(shared_ptr<mocker::ir::IRInst> *)(pEVar4 + 0x10));
        in_RAX = sVar7.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_70.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pvVar3 = (vector<mocker::DefUseChain::Use,std::allocator<mocker::DefUseChain::Use>> *)
                   std::__detail::
                   _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this,(key_type *)&local_70);
          std::vector<mocker::DefUseChain::Use,std::allocator<mocker::DefUseChain::Use>>::
          _M_assign_aux<mocker::DefUseChain::Use_const*>(pvVar3,0,0);
          in_RAX = extraout_RAX;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_70.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_70.
                     super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          in_RAX = extraout_RAX_00;
        }
      }
      pEVar6 = *(EVP_PKEY_CTX **)pEVar6;
    } while (pEVar6 != pEVar5);
    pEVar6 = *(EVP_PKEY_CTX **)pEVar5;
  }
  if (pEVar6 != pEVar5) {
    local_58 = pEVar5;
    do {
      pEVar5 = pEVar6 + 0x18;
      pEVar4 = *(EVP_PKEY_CTX **)(pEVar6 + 0x18);
      local_50 = pEVar5;
      if (pEVar4 != pEVar5) {
        do {
          ir::getOperandsUsed(&local_70,(shared_ptr<mocker::ir::IRInst> *)(pEVar4 + 0x10));
          psVar1 = local_70.
                   super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (addr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_70.
                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
              addr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1; addr = addr + 1) {
            ir::dycLocalReg((ir *)&local_40,(shared_ptr<mocker::ir::Addr> *)addr);
            if (local_40 != 0) {
              pvVar3 = (vector<mocker::DefUseChain::Use,std::allocator<mocker::DefUseChain::Use>> *)
                       std::__detail::
                       _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)this,(key_type *)&local_40);
              local_48 = *(unsigned_long *)(pEVar6 + 0x10);
              std::vector<mocker::DefUseChain::Use,std::allocator<mocker::DefUseChain::Use>>::
              emplace_back<unsigned_long,std::shared_ptr<mocker::ir::IRInst>const&>
                        (pvVar3,&local_48,(shared_ptr<mocker::ir::IRInst> *)(pEVar4 + 0x10));
            }
            if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
            }
          }
          std::
          vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ::~vector(&local_70);
          pEVar4 = *(EVP_PKEY_CTX **)pEVar4;
          pEVar5 = extraout_RAX_01;
        } while (pEVar4 != local_50);
      }
      iVar2 = (int)pEVar5;
      pEVar6 = *(EVP_PKEY_CTX **)pEVar6;
    } while (pEVar6 != local_58);
  }
  return iVar2;
}

Assistant:

void init(const ir::FunctionModule &func) {
    for (auto &bb : func.getBBs()) {
      for (auto &inst : bb.getInsts()) {
        if (auto dest = ir::getDest(inst))
          chain[dest] = {};
      }
    }

    for (auto &bb : func.getBBs()) {
      for (auto &inst : bb.getInsts()) {
        auto operands = ir::getOperandsUsed(inst);
        for (auto &operand : operands) {
          auto reg = ir::dycLocalReg(operand);
          if (!reg)
            continue;
          chain[reg].emplace_back(bb.getLabelID(), inst);
        }
      }
    }
  }